

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O3

char * get_quoted_string(char **string,size_t *output_string_len)

{
  size_t __n;
  char cVar1;
  byte bVar2;
  JSON_Status JVar3;
  byte *__src;
  long lVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  byte *pbVar9;
  char *pcVar10;
  char *pcVar11;
  uint local_4c;
  byte *local_48;
  uint local_3c;
  ulong local_38;
  
  pcVar5 = *string;
  pcVar10 = pcVar5;
  if (*pcVar5 == '\"') {
    do {
      while( true ) {
        pcVar11 = pcVar10;
        *string = pcVar11 + 1;
        cVar1 = pcVar11[1];
        if (cVar1 != '\\') break;
        *string = pcVar11 + 2;
        pcVar10 = pcVar11 + 2;
        if (pcVar11[2] == '\0') {
          return (char *)0x0;
        }
      }
      if (cVar1 == '\0') {
        return (char *)0x0;
      }
      pcVar10 = pcVar11 + 1;
    } while (cVar1 != '\"');
    *string = pcVar11 + 2;
    lVar8 = (long)(pcVar11 + 2) - (long)pcVar5;
    __src = (byte *)(*parson_malloc)(lVar8 - 1);
    if (__src != (byte *)0x0) {
      bVar2 = pcVar5[1];
      pbVar9 = __src;
      if (lVar8 != 2 && bVar2 != 0) {
        pcVar10 = pcVar5 + 1;
        do {
          if (bVar2 == 0x5c) {
            pcVar11 = pcVar10 + 1;
            bVar2 = pcVar10[1];
            if (bVar2 < 0x62) {
              if (bVar2 == 0x22) {
                *pbVar9 = 0x22;
              }
              else if (bVar2 == 0x2f) {
                *pbVar9 = 0x2f;
              }
              else {
                if (bVar2 != 0x5c) goto switchD_0017725a_caseD_6f;
                *pbVar9 = 0x5c;
              }
            }
            else {
              switch(bVar2) {
              case 0x6e:
                *pbVar9 = 10;
                break;
              case 0x6f:
              case 0x70:
              case 0x71:
              case 0x73:
                goto switchD_0017725a_caseD_6f;
              case 0x72:
                *pbVar9 = 0xd;
                break;
              case 0x74:
                *pbVar9 = 9;
                break;
              case 0x75:
                local_48 = __src;
                JVar3 = parse_utf16_hex(pcVar10 + 2,&local_4c);
                __src = local_48;
                if (JVar3 != 0) goto switchD_0017725a_caseD_6f;
                bVar2 = (byte)local_4c;
                if (local_4c < 0x80) {
                  *pbVar9 = bVar2;
                  lVar4 = 1;
                }
                else {
                  if (local_4c < 0x800) {
                    *pbVar9 = (byte)(local_4c >> 6) | 0xc0;
                    pbVar9[1] = bVar2 & 0x3f | 0x80;
                    pbVar9 = pbVar9 + 1;
                  }
                  else {
                    if (0xfffff7ff < local_4c - 0xe000) {
                      if ((((local_4c < 0xdc00) && (pcVar10[6] == '\\')) && (pcVar10[7] == 'u')) &&
                         ((local_38 = (ulong)local_4c,
                          JVar3 = parse_utf16_hex(pcVar10 + 8,&local_3c), __src = local_48,
                          JVar3 == 0 && (0xfffffbff < local_3c - 0xe000)))) {
                        uVar7 = ((uint)local_38 & 0x3ff) * 0x400;
                        uVar6 = (local_3c & 0x3ff) + uVar7 + 0x10000;
                        *pbVar9 = (byte)(uVar6 >> 0x12) | 0xf0;
                        pbVar9[1] = (byte)(uVar6 >> 0xc) & 0x3f | 0x80;
                        pbVar9[2] = (byte)((local_3c & 0x3ff | uVar7) >> 6) & 0x3f | 0x80;
                        pbVar9[3] = (byte)local_3c & 0x3f | 0x80;
                        pbVar9 = pbVar9 + 3;
                        lVar4 = 7;
                        goto LAB_00177345;
                      }
                      goto switchD_0017725a_caseD_6f;
                    }
                    *pbVar9 = (byte)(local_4c >> 0xc) & 0xf | 0xe0;
                    pbVar9[1] = (byte)(local_4c >> 6) & 0x3f | 0x80;
                    pbVar9[2] = bVar2 & 0x3f | 0x80;
                    pbVar9 = pbVar9 + 2;
                  }
                  lVar4 = 1;
                }
LAB_00177345:
                pcVar11 = pcVar11 + lVar4 + 3;
                __src = local_48;
                break;
              default:
                if (bVar2 == 0x62) {
                  *pbVar9 = 8;
                }
                else {
                  if (bVar2 != 0x66) goto switchD_0017725a_caseD_6f;
                  *pbVar9 = 0xc;
                }
              }
            }
          }
          else {
            if (bVar2 < 0x20) goto switchD_0017725a_caseD_6f;
            *pbVar9 = bVar2;
            pcVar11 = pcVar10;
          }
          pbVar9 = pbVar9 + 1;
          bVar2 = pcVar11[1];
        } while ((bVar2 != 0) &&
                (pcVar10 = pcVar11 + 1, (ulong)((long)pcVar10 - (long)(pcVar5 + 1)) < lVar8 - 2U));
      }
      *pbVar9 = 0;
      __n = ((long)pbVar9 - (long)__src) + 1;
      pcVar5 = (char *)(*parson_malloc)(__n);
      if (pcVar5 != (char *)0x0) {
        memcpy(pcVar5,__src,__n);
        *output_string_len = (long)pbVar9 - (long)__src;
        (*parson_free)(__src);
        return pcVar5;
      }
    }
switchD_0017725a_caseD_6f:
    (*parson_free)(__src);
  }
  return (char *)0x0;
}

Assistant:

static char * get_quoted_string(const char **string, size_t *output_string_len) {
    const char *string_start = *string;
    size_t input_string_len = 0;
    JSON_Status status = skip_quotes(string);
    if (status != JSONSuccess) {
        return NULL;
    }
    input_string_len = *string - string_start - 2; /* length without quotes */
    return process_string(string_start + 1, input_string_len, output_string_len);
}